

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gga_xc_b97.c
# Opt level: O0

void gga_xc_b97_init(xc_func_type *p)

{
  void *pvVar1;
  xc_func_type *in_RDI;
  
  pvVar1 = malloc(0x78);
  in_RDI->params = pvVar1;
  if (((((in_RDI->info->number == 0x197) || (in_RDI->info->number == 0x198)) ||
       (in_RDI->info->number == 0x19a)) ||
      ((((in_RDI->info->number == 0x19d || (in_RDI->info->number == 0x19e)) ||
        ((in_RDI->info->number == 0x1a4 ||
         ((in_RDI->info->number == 0x1a5 || (in_RDI->info->number == 0x1a6)))))) ||
       (in_RDI->info->number == 0x1a7)))) ||
     (((in_RDI->info->number == 0x1a8 || (in_RDI->info->number == 0x1a9)) ||
      (in_RDI->info->number == 0x10a)))) {
    xc_hyb_init_hybrid(in_RDI,0.0);
  }
  return;
}

Assistant:

static void
gga_xc_b97_init(xc_func_type *p)
{
  assert(p->params == NULL);
  p->params = libxc_malloc(sizeof(gga_xc_b97_params));

  if(p->info->number == XC_HYB_GGA_XC_B97   ||
     p->info->number == XC_HYB_GGA_XC_B97_1 ||
     p->info->number == XC_HYB_GGA_XC_B97_2 ||
     p->info->number == XC_HYB_GGA_XC_B97_K ||
     p->info->number == XC_HYB_GGA_XC_B97_3 ||
     p->info->number == XC_HYB_GGA_XC_SB98_1A ||
     p->info->number == XC_HYB_GGA_XC_SB98_1B ||
     p->info->number == XC_HYB_GGA_XC_SB98_1C ||
     p->info->number == XC_HYB_GGA_XC_SB98_2A ||
     p->info->number == XC_HYB_GGA_XC_SB98_2B ||
     p->info->number == XC_HYB_GGA_XC_SB98_2C ||
     p->info->number == XC_HYB_GGA_XC_B97_1P){
    xc_hyb_init_hybrid(p, 0.0);
  }

}